

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<solitaire::graphics::TextureId>,testing::Matcher<solitaire::geometry::Position_const&>,testing::Matcher<solitaire::geometry::Area_const&>>,std::tuple<solitaire::graphics::TextureId,solitaire::geometry::Position_const&,solitaire::geometry::Area_const&>>
               (tuple<testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<const_solitaire::geometry::Position_&>,_testing::Matcher<const_solitaire::geometry::Area_&>_>
                *matcher_tuple,
               tuple<solitaire::graphics::TextureId,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&>
               *value_tuple)

{
  bool bVar1;
  MatcherBase<const_solitaire::geometry::Position_&> *this;
  Position *x;
  undefined1 local_19;
  tuple<solitaire::graphics::TextureId,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&>
  *value_tuple_local;
  tuple<testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<const_solitaire::geometry::Position_&>,_testing::Matcher<const_solitaire::geometry::Area_&>_>
  *matcher_tuple_local;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<solitaire::graphics::TextureId>,testing::Matcher<solitaire::geometry::Position_const&>,testing::Matcher<solitaire::geometry::Area_const&>>,std::tuple<solitaire::graphics::TextureId,solitaire::geometry::Position_const&,solitaire::geometry::Area_const&>>
                    (matcher_tuple,value_tuple);
  local_19 = false;
  if (bVar1) {
    this = &std::
            get<1ul,testing::Matcher<solitaire::graphics::TextureId>,testing::Matcher<solitaire::geometry::Position_const&>,testing::Matcher<solitaire::geometry::Area_const&>>
                      (matcher_tuple)->super_MatcherBase<const_solitaire::geometry::Position_&>;
    x = std::
        get<1ul,solitaire::graphics::TextureId,solitaire::geometry::Position_const&,solitaire::geometry::Area_const&>
                  (value_tuple);
    local_19 = MatcherBase<const_solitaire::geometry::Position_&>::Matches(this,x);
  }
  return local_19;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }